

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::LogFinish(void)

{
  FILE *__stream;
  _func_void_char_ptr *p_Var1;
  ImGuiContext *pIVar2;
  
  pIVar2 = GImGui;
  if (GImGui->LogEnabled == true) {
    LogText("\n");
    pIVar2->LogEnabled = false;
    __stream = (FILE *)pIVar2->LogFile;
    if (__stream != (FILE *)0x0) {
      if (__stream == _stdout) {
        fflush(__stream);
      }
      else {
        fclose(__stream);
      }
      pIVar2->LogFile = (FILE *)0x0;
    }
    if (2 < (pIVar2->LogClipboard->Buf).Size) {
      p_Var1 = (pIVar2->IO).SetClipboardTextFn;
      if (p_Var1 != (_func_void_char_ptr *)0x0) {
        (*p_Var1)((pIVar2->LogClipboard->Buf).Data);
      }
      ImGuiTextBuffer::clear(pIVar2->LogClipboard);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::LogFinish()
{
    ImGuiContext& g = *GImGui;
    if (!g.LogEnabled)
        return;

    LogText(IM_NEWLINE);
    g.LogEnabled = false;
    if (g.LogFile != NULL)
    {
        if (g.LogFile == stdout)
            fflush(g.LogFile);
        else
            fclose(g.LogFile);
        g.LogFile = NULL;
    }
    if (g.LogClipboard->size() > 1)
    {
        if (g.IO.SetClipboardTextFn)
            g.IO.SetClipboardTextFn(g.LogClipboard->begin());
        g.LogClipboard->clear();
    }
}